

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O0

void Am_Choice_Command_Repeat_New_As_Same_proc
               (Am_Object *command_obj,Am_Value *param_2,Am_Value *param_3)

{
  Am_Value local_38;
  Am_Object local_28;
  Am_Value *local_20;
  Am_Value *param_2_local;
  Am_Value *param_1_local;
  Am_Object *command_obj_local;
  
  local_20 = param_3;
  param_2_local = param_2;
  param_1_local = (Am_Value *)command_obj;
  Am_Object::Am_Object(&local_28,command_obj);
  Am_Value::Am_Value(&local_38,0);
  choice_general_undo_redo(&local_28,false,true,false,&local_38);
  Am_Value::~Am_Value(&local_38);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Selective_Repeat_New_Method, void,
                 Am_Choice_Command_Repeat_New_As_Same,
                 (Am_Object command_obj, Am_Value /* new_selection */,
                  Am_Value /* new_val */))
{
  choice_general_undo_redo(command_obj, false, true, false, (0L));
}